

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateServiceOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  string *element_name;
  bool bVar1;
  int i;
  int index;
  allocator<char> local_51;
  string local_50;
  
  bVar1 = IsLite(*(FileDescriptor **)(service + 0x10));
  if ((bVar1) &&
     ((*(char *)(*(long *)(*(long *)(service + 0x10) + 0x88) + 0x56) != '\0' ||
      (*(char *)(*(long *)(*(long *)(service + 0x10) + 0x88) + 0x57) == '\x01')))) {
    element_name = *(string **)(service + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "Files with optimize_for = LITE_RUNTIME cannot define services unless you set both options cc_generic_services and java_generic_sevices to false."
               ,&local_51);
    AddError(this,element_name,&proto->super_Message,NAME,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (index = 0; index < *(int *)(service + 0x20); index = index + 1) {
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
              (&(proto->method_).super_RepeatedPtrFieldBase,index);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateServiceOptions(ServiceDescriptor* service,
    const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_sevices to false.");
  }

  VALIDATE_OPTIONS_FROM_ARRAY(service, method, Method);
}